

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall
pbrt::BinaryWriter::write<std::pair<float,float>,std::allocator<std::pair<float,float>>,void,void>
          (BinaryWriter *this,
          vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *t)

{
  size_type sVar1;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *in_RSI;
  BinaryWriter *in_RDI;
  size_t i;
  size_t size;
  pair<float,_float> *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  
  sVar1 = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::size
                    (in_RSI);
  write<unsigned_long>(in_RDI,(unsigned_long *)in_stack_ffffffffffffffc8);
  for (local_28 = 0; local_28 < sVar1; local_28 = local_28 + 1) {
    std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::operator[]
              (in_RSI,local_28);
    write<std::pair<float,float>>(in_RDI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void write(const std::vector<T, A> &t)
    {
      size_t size = t.size();
      write((uint64_t)size);
      for (size_t i=0;i<size;i++)
        write(t[i]);
    }